

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O0

void Sim_UtilInfoDetectDiffs(uint *pInfo1,uint *pInfo2,int nWords,Vec_Int_t *vDiffs)

{
  uint uVar1;
  uint uVar2;
  int local_30;
  uint uMask;
  int b;
  int w;
  Vec_Int_t *vDiffs_local;
  int nWords_local;
  uint *pInfo2_local;
  uint *pInfo1_local;
  
  vDiffs->nSize = 0;
  for (uMask = 0; (int)uMask < nWords; uMask = uMask + 1) {
    uVar1 = pInfo2[(int)uMask];
    uVar2 = pInfo1[(int)uMask];
    if ((uVar1 ^ uVar2) != 0) {
      for (local_30 = 0; local_30 < 0x20; local_30 = local_30 + 1) {
        if (((uVar1 ^ uVar2) & 1 << ((byte)local_30 & 0x1f)) != 0) {
          Vec_IntPush(vDiffs,uMask * 0x20 + local_30);
        }
      }
    }
  }
  return;
}

Assistant:

void Sim_UtilInfoDetectDiffs( unsigned * pInfo1, unsigned * pInfo2, int nWords, Vec_Int_t * vDiffs )
{
    int w, b;
    unsigned uMask;
    vDiffs->nSize = 0;
    for ( w = 0; w < nWords; w++ )
        if ( (uMask = (pInfo2[w] ^ pInfo1[w])) )
            for ( b = 0; b < 32; b++ )
                if ( uMask & (1 << b) )
                    Vec_IntPush( vDiffs, 32*w + b );
}